

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O2

void __thiscall
Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>::
Compressed_distance_matrix
          (Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0> *this,
          vector<float,_std::allocator<float>_> *_distances)

{
  long lVar1;
  pointer pfVar2;
  ulong uVar3;
  logic_error *this_00;
  double dVar4;
  undefined1 auVar5 [16];
  allocator_type local_21;
  
  pfVar2 = (_distances->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start =
       (_distances->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = pfVar2;
  (this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (_distances->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (_distances->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (_distances->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (_distances->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lVar1 = ((long)(this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start) * 2 + 1;
  auVar5._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar5._0_8_ = lVar1;
  auVar5._12_4_ = 0x45300000;
  dVar4 = (SQRT((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) + 1.0) * 0.5;
  uVar3 = (ulong)dVar4;
  std::vector<float_*,_std::allocator<float_*>_>::vector
            (&this->rows,(long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3,
             &local_21);
  uVar3 = (long)(this->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  if ((long)(this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start >> 2 ==
      (ulong)(((long)(uVar3 * 0x20000000 + -0x100000000) >> 0x20) * (long)(int)(uVar3 >> 3)) >> 1) {
    init_rows(this);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Compressed_distance_matrix(std::vector<value_t>&& _distances)
      : distances(std::move(_distances)), rows((1 + std::sqrt(1 + 8 * distances.size())) / 2) {
        GUDHI_assert(distances.size() == (std::size_t)size() * (size() - 1) / 2);
        init_rows();
      }